

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O3

string * __thiscall
soul::TokenisedPathString::getLastPart_abi_cxx11_
          (string *__return_storage_ptr__,TokenisedPathString *this)

{
  size_t sVar1;
  Section *pSVar2;
  Section s;
  
  sVar1 = (this->sections).numActive;
  if (sVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pSVar2 = (this->sections).items;
    s.end = pSVar2[sVar1 - 1].end;
    s.start = pSVar2[sVar1 - 1].start;
    getSection_abi_cxx11_(__return_storage_ptr__,this,s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getLastPart() const
    {
        if (sections.empty())
            return {};

        return getSection (sections.back());
    }